

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

char * __thiscall rtosc::Port::MetaContainer::operator[](MetaContainer *this,char *str)

{
  bool bVar1;
  int iVar2;
  MetaIterator *pMVar3;
  char *in_RSI;
  MetaIterator a;
  MetaIterator x;
  MetaIterator __end1;
  MetaIterator __begin1;
  MetaContainer *__range1;
  MetaContainer *in_stack_ffffffffffffffa0;
  MetaIterator *this_00;
  MetaIterator local_30;
  char *local_18;
  
  local_18 = in_RSI;
  local_30 = begin(in_stack_ffffffffffffffa0);
  a = end((MetaContainer *)0x106776);
  while( true ) {
    bVar1 = MetaIterator::operator!=(&local_30,a);
    if (!bVar1) {
      return (char *)0x0;
    }
    pMVar3 = MetaIterator::operator*(&local_30);
    this_00 = (MetaIterator *)pMVar3->value;
    iVar2 = strcmp(pMVar3->title,local_18);
    if (iVar2 == 0) break;
    MetaIterator::operator++(this_00);
  }
  return (char *)this_00;
}

Assistant:

const char *Port::MetaContainer::operator[](const char *str) const
{
    for(const auto x : *this)
        if(!strcmp(x.title, str))
            return x.value;
    return NULL;
}